

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O0

bool __thiscall c4::yml::Parser::_handle_unk(Parser *this)

{
  Location LVar1;
  Location LVar2;
  Location LVar3;
  Location LVar4;
  ro_substr pattern;
  ro_substr pattern_00;
  ro_substr pattern_01;
  ro_substr pattern_02;
  ro_substr pattern_03;
  ro_substr pattern_04;
  ro_substr pattern_05;
  ro_substr pattern_06;
  ro_substr pattern_07;
  ro_substr pattern_08;
  ro_substr pattern_09;
  ro_substr pattern_10;
  ro_substr pattern_11;
  ro_substr pattern_12;
  ro_substr pattern_13;
  ro_substr pattern_14;
  ro_substr chars;
  ro_substr chars_00;
  ro_substr chars_01;
  ro_substr chars_02;
  ro_substr chars_03;
  csubstr s;
  csubstr s_00;
  csubstr rem_00;
  csubstr rem_01;
  csubstr rem_02;
  csubstr val;
  ro_substr chars_04;
  bool bVar5;
  error_flags eVar6;
  int iVar7;
  NodeData *pNVar8;
  size_t sVar9;
  char *pcVar10;
  char *pcVar11;
  Parser *in_RDI;
  csubstr ws_1;
  size_t first;
  bool is_quoted_1;
  size_t indentation;
  csubstr scalar;
  char msg_3 [32];
  size_t n_1;
  size_t n;
  bool is_quoted;
  csubstr saved_scalar;
  csubstr ws;
  char msg_2 [41];
  char msg_1 [33];
  size_t indref;
  char msg [39];
  basic_substring<const_char> trimmed;
  bool start_as_child;
  csubstr rem;
  const_iterator e;
  const_iterator b;
  const_iterator sse;
  size_t rnum;
  size_t rnum_1;
  flag_t in_stack_fffffffffffff738;
  flag_t in_stack_fffffffffffff73c;
  Parser *in_stack_fffffffffffff740;
  Parser *in_stack_fffffffffffff748;
  undefined7 in_stack_fffffffffffff750;
  char in_stack_fffffffffffff757;
  basic_substring<const_char> *in_stack_fffffffffffff758;
  undefined7 in_stack_fffffffffffff760;
  char in_stack_fffffffffffff767;
  undefined6 in_stack_fffffffffffff768;
  undefined1 in_stack_fffffffffffff76e;
  undefined1 in_stack_fffffffffffff76f;
  Parser *in_stack_fffffffffffff770;
  undefined5 in_stack_fffffffffffff778;
  undefined1 in_stack_fffffffffffff77d;
  undefined1 in_stack_fffffffffffff77e;
  undefined1 in_stack_fffffffffffff77f;
  size_t in_stack_fffffffffffff780;
  undefined4 in_stack_fffffffffffff788;
  undefined2 in_stack_fffffffffffff78c;
  undefined1 in_stack_fffffffffffff78e;
  undefined1 in_stack_fffffffffffff78f;
  undefined7 in_stack_fffffffffffff790;
  undefined7 uVar12;
  char in_stack_fffffffffffff797;
  undefined1 uVar13;
  undefined5 in_stack_fffffffffffff798;
  undefined1 in_stack_fffffffffffff79d;
  undefined1 in_stack_fffffffffffff79e;
  undefined1 in_stack_fffffffffffff79f;
  size_t in_stack_fffffffffffff7a0;
  undefined7 in_stack_fffffffffffff7a8;
  undefined1 in_stack_fffffffffffff7af;
  char *in_stack_fffffffffffff7b0;
  undefined4 in_stack_fffffffffffff7b8;
  undefined1 in_stack_fffffffffffff7bc;
  undefined1 in_stack_fffffffffffff7bd;
  undefined1 in_stack_fffffffffffff7be;
  undefined1 in_stack_fffffffffffff7bf;
  Parser *in_stack_fffffffffffff7d8;
  undefined8 *puVar14;
  undefined6 in_stack_fffffffffffff7e0;
  undefined1 in_stack_fffffffffffff7e6;
  undefined1 in_stack_fffffffffffff7e7;
  undefined7 in_stack_fffffffffffff7e8;
  undefined1 in_stack_fffffffffffff7ef;
  Parser *in_stack_fffffffffffff7f0;
  char *in_stack_fffffffffffff7f8;
  pfn_error p_Var15;
  Parser *in_stack_fffffffffffff800;
  undefined7 in_stack_fffffffffffff808;
  undefined1 in_stack_fffffffffffff80f;
  undefined6 in_stack_fffffffffffff818;
  undefined1 in_stack_fffffffffffff81e;
  undefined1 uVar16;
  undefined1 in_stack_fffffffffffff81f;
  Parser *in_stack_fffffffffffff820;
  undefined7 in_stack_fffffffffffff878;
  undefined1 in_stack_fffffffffffff87f;
  Parser *in_stack_fffffffffffff880;
  basic_substring<char_const> local_768 [12];
  flag_t in_stack_fffffffffffff8a4;
  Parser *in_stack_fffffffffffff8a8;
  char *in_stack_fffffffffffff8b0;
  size_t in_stack_fffffffffffff8b8;
  basic_substring<char_const> local_738 [16];
  char *local_728;
  char *local_720;
  ro_substr local_718;
  basic_substring<char_const> local_708 [16];
  char *local_6f8;
  size_t local_6f0;
  undefined8 in_stack_fffffffffffff918;
  flag_t quoted;
  Parser *in_stack_fffffffffffff920;
  csubstr in_stack_fffffffffffff928;
  basic_substring<const_char> local_6b0;
  undefined8 local_6a0;
  undefined8 uStack_698;
  undefined8 local_690;
  undefined8 uStack_688;
  basic_substring<const_char> *local_680;
  Parser *in_stack_fffffffffffff988;
  Parser *in_stack_fffffffffffff990;
  char *local_638;
  char *local_630;
  basic_substring<char_const> local_628 [8];
  bool *in_stack_fffffffffffff9e0;
  csubstr *in_stack_fffffffffffff9e8;
  Parser *in_stack_fffffffffffff9f0;
  basic_substring<char_const> local_600 [16];
  basic_substring<char_const> local_5f0 [32];
  basic_substring<char_const> local_5d0 [16];
  char *local_5c0;
  size_t local_5b8;
  basic_substring<char_const> local_5b0 [16];
  basic_substring<char_const> local_5a0 [16];
  basic_substring<char_const> local_590 [16];
  basic_substring<char_const> local_580 [16];
  basic_substring<char_const> local_570 [7];
  undefined1 in_stack_fffffffffffffa97;
  Parser *in_stack_fffffffffffffa98;
  basic_substring<char_const> local_540 [16];
  char *local_530;
  char *local_528;
  basic_substring<char_const> local_520 [23];
  Parser *in_stack_fffffffffffffaf8;
  size_t local_500;
  basic_substring<const_char> local_4f0;
  basic_substring<char_const> local_4e0 [16];
  basic_substring<char_const> local_4d0 [16];
  basic_substring<char_const> local_4c0 [16];
  char *local_4b0;
  char *local_4a8;
  char *local_4a0;
  char *local_498;
  size_t local_490;
  Parser *pPStack_488;
  Parser *local_480;
  undefined8 uStack_478;
  basic_substring<const_char> *local_470;
  char local_468 [56];
  char *local_430;
  Parser *pPStack_428;
  Parser *local_420;
  size_t sStack_418;
  basic_substring<const_char> *local_410;
  char local_408 [8];
  Parser *in_stack_fffffffffffffc00;
  csubstr in_stack_fffffffffffffc08;
  basic_substring<char_const> local_3c0 [16];
  char *local_3b0;
  char *local_3a8;
  size_t local_3a0;
  char *pcStack_398;
  size_t local_390;
  char *pcStack_388;
  size_t local_380;
  undefined1 local_378 [56];
  basic_substring<const_char> local_340;
  char *local_330;
  char *local_328;
  basic_substring<char_const> local_320 [23];
  undefined1 local_309;
  undefined1 local_308 [64];
  undefined4 local_2c8;
  char *local_2c0;
  char *local_2b8;
  char *local_2b0;
  char *local_2a8;
  char *local_2a0;
  undefined4 local_298;
  char *local_290;
  Parser *local_288;
  char *local_280;
  char *local_278;
  char *local_270;
  undefined4 local_268;
  char *local_260;
  char *local_258;
  char *local_250;
  char *local_248;
  char *local_240;
  char *local_238;
  char *local_230;
  Parser *in_stack_fffffffffffffdd8;
  char *local_1d0;
  char *local_1c8;
  char *local_1a0;
  char *local_198;
  char *local_120;
  char *local_118;
  char *local_110;
  char *local_108;
  char **local_100;
  char *local_f8;
  char *local_f0;
  char *local_e8;
  bool local_d9;
  char *local_d8;
  undefined4 local_d0;
  char *local_c8;
  char *local_c0;
  undefined4 local_b8;
  char *local_b0;
  flag_t local_a8;
  char *local_a0;
  char *local_98;
  char *local_90;
  char *local_88;
  char *local_80;
  char *local_68;
  char *local_40;
  char *local_38;
  char *local_30;
  char *local_28;
  char *local_20;
  char *local_18;
  char *local_10;
  char **local_8;
  
  quoted = (flag_t)((ulong)in_stack_fffffffffffff918 >> 0x20);
  local_308._0_8_ = (in_RDI->m_state->line_contents).rem.str;
  local_308._8_8_ = (in_RDI->m_state->line_contents).rem.len;
  pNVar8 = node(in_stack_fffffffffffff740,
                (State *)CONCAT44(in_stack_fffffffffffff73c,in_stack_fffffffffffff738));
  local_309 = pNVar8 == (NodeData *)0x0;
  bVar5 = has_any(in_RDI,0x1000);
  if (bVar5) {
    iVar7 = basic_substring<const_char>::compare
                      ((basic_substring<const_char> *)
                       CONCAT17(in_stack_fffffffffffff7bf,
                                CONCAT16(in_stack_fffffffffffff7be,
                                         CONCAT15(in_stack_fffffffffffff7bd,
                                                  CONCAT14(in_stack_fffffffffffff7bc,
                                                           in_stack_fffffffffffff7b8)))),
                       in_stack_fffffffffffff7b0,
                       CONCAT17(in_stack_fffffffffffff7af,in_stack_fffffffffffff7a8));
    if (iVar7 == 0) {
LAB_00301abd:
      local_330 = (char *)local_308._0_8_;
      local_328 = (char *)local_308._8_8_;
      rem_00.str._7_1_ = in_stack_fffffffffffff7ef;
      rem_00.str._0_7_ = in_stack_fffffffffffff7e8;
      rem_00.len = (size_t)in_stack_fffffffffffff7f0;
      _start_new_doc((Parser *)
                     CONCAT17(in_stack_fffffffffffff7e7,
                              CONCAT16(in_stack_fffffffffffff7e6,in_stack_fffffffffffff7e0)),rem_00)
      ;
      return true;
    }
    basic_substring<char_const>::basic_substring<5ul>(local_320,(char (*) [5])"--- ");
    pattern.str._7_1_ = in_stack_fffffffffffff767;
    pattern.str._0_7_ = in_stack_fffffffffffff760;
    pattern.len._0_6_ = in_stack_fffffffffffff768;
    pattern.len._6_1_ = in_stack_fffffffffffff76e;
    pattern.len._7_1_ = in_stack_fffffffffffff76f;
    bVar5 = basic_substring<const_char>::begins_with(in_stack_fffffffffffff758,pattern);
    if (bVar5) goto LAB_00301abd;
    local_340 = basic_substring<const_char>::triml
                          ((basic_substring<const_char> *)
                           CONCAT17(in_stack_fffffffffffff79f,
                                    CONCAT16(in_stack_fffffffffffff79e,
                                             CONCAT15(in_stack_fffffffffffff79d,
                                                      in_stack_fffffffffffff798))),
                           in_stack_fffffffffffff797);
    in_stack_fffffffffffffdd8 = (Parser *)&local_340;
    local_230 = "---";
    iVar7 = basic_substring<const_char>::compare
                      ((basic_substring<const_char> *)
                       CONCAT17(in_stack_fffffffffffff7bf,
                                CONCAT16(in_stack_fffffffffffff7be,
                                         CONCAT15(in_stack_fffffffffffff7bd,
                                                  CONCAT14(in_stack_fffffffffffff7bc,
                                                           in_stack_fffffffffffff7b8)))),
                       in_stack_fffffffffffff7b0,
                       CONCAT17(in_stack_fffffffffffff7af,in_stack_fffffffffffff7a8));
    if (iVar7 == 0) {
LAB_00301ba1:
      if ((ulong)local_308._8_8_ < local_340.len) {
        memcpy(local_378,"check failed: (rem.len >= trimmed.len)",0x27);
        eVar6 = get_error_flags();
        if (((eVar6 & 1) != 0) && (bVar5 = is_debugger_attached(), bVar5)) {
          trap_instruction();
        }
        p_Var15 = (in_RDI->m_stack).m_callbacks.m_error;
        in_stack_fffffffffffff880 = (Parser *)local_378;
        Location::Location((Location *)CONCAT17(in_stack_fffffffffffff767,in_stack_fffffffffffff760)
                           ,(char *)in_stack_fffffffffffff758,
                           CONCAT17(in_stack_fffffffffffff757,in_stack_fffffffffffff750),
                           (size_t)in_stack_fffffffffffff748,(size_t)in_stack_fffffffffffff740);
        LVar1.super_LineCol.line = (size_t)pcStack_398;
        LVar1.super_LineCol.offset = local_3a0;
        LVar1.super_LineCol.col = local_390;
        LVar1.name.str._0_7_ = (int7)pcStack_388;
        LVar1.name.str._7_1_ = (char)((ulong)pcStack_388 >> 0x38);
        LVar1.name.len = local_380;
        (*p_Var15)((char *)in_stack_fffffffffffff880,0x27,LVar1,
                   (in_RDI->m_stack).m_callbacks.m_user_data);
      }
      _line_progressed(in_stack_fffffffffffff820,
                       CONCAT17(in_stack_fffffffffffff81f,
                                CONCAT16(in_stack_fffffffffffff81e,in_stack_fffffffffffff818)));
      local_3b0 = local_340.str;
      local_3a8 = (char *)local_340.len;
      rem_01.str._7_1_ = in_stack_fffffffffffff7ef;
      rem_01.str._0_7_ = in_stack_fffffffffffff7e8;
      rem_01.len = (size_t)in_stack_fffffffffffff7f0;
      _start_new_doc((Parser *)
                     CONCAT17(in_stack_fffffffffffff7e7,
                              CONCAT16(in_stack_fffffffffffff7e6,in_stack_fffffffffffff7e0)),rem_01)
      ;
      _save_indentation(in_stack_fffffffffffff880,
                        CONCAT17(in_stack_fffffffffffff87f,in_stack_fffffffffffff878));
      return true;
    }
    basic_substring<char_const>::basic_substring<5ul>
              ((basic_substring<char_const> *)(local_378 + 0x28),(char (*) [5])"--- ");
    pattern_00.str._7_1_ = in_stack_fffffffffffff767;
    pattern_00.str._0_7_ = in_stack_fffffffffffff760;
    pattern_00.len._0_6_ = in_stack_fffffffffffff768;
    pattern_00.len._6_1_ = in_stack_fffffffffffff76e;
    pattern_00.len._7_1_ = in_stack_fffffffffffff76f;
    bVar5 = basic_substring<const_char>::begins_with(in_stack_fffffffffffff758,pattern_00);
    if (bVar5) goto LAB_00301ba1;
    basic_substring<char_const>::basic_substring<4ul>(local_3c0,(char (*) [4])0x347579);
    pattern_01.str._7_1_ = in_stack_fffffffffffff767;
    pattern_01.str._0_7_ = in_stack_fffffffffffff760;
    pattern_01.len._0_6_ = in_stack_fffffffffffff768;
    pattern_01.len._6_1_ = in_stack_fffffffffffff76e;
    pattern_01.len._7_1_ = in_stack_fffffffffffff76f;
    bVar5 = basic_substring<const_char>::begins_with(in_stack_fffffffffffff758,pattern_01);
    if (bVar5) {
      _end_stream(in_stack_fffffffffffff988);
    }
    else {
      basic_substring<char_const>::basic_substring<3ul>
                ((basic_substring<char_const> *)&stack0xfffffffffffffc30,(char (*) [3])"#%");
      chars_03.str._7_1_ = in_stack_fffffffffffff797;
      chars_03.str._0_7_ = in_stack_fffffffffffff790;
      chars_03.len._0_5_ = in_stack_fffffffffffff798;
      chars_03.len._5_1_ = in_stack_fffffffffffff79d;
      chars_03.len._6_1_ = in_stack_fffffffffffff79e;
      chars_03.len._7_1_ = in_stack_fffffffffffff79f;
      sVar9 = basic_substring<const_char>::first_of
                        ((basic_substring<const_char> *)
                         CONCAT17(in_stack_fffffffffffff78f,
                                  CONCAT16(in_stack_fffffffffffff78e,
                                           CONCAT24(in_stack_fffffffffffff78c,
                                                    in_stack_fffffffffffff788))),chars_03,
                         in_stack_fffffffffffff780);
      if (sVar9 == 0xffffffffffffffff) {
        sVar9 = in_RDI->m_state->indref;
        _push_level(in_stack_fffffffffffff7f0,(bool)in_stack_fffffffffffff7ef);
        _start_doc(in_stack_fffffffffffff990,SUB81((ulong)in_stack_fffffffffffff988 >> 0x38,0));
        _set_indentation(in_RDI,sVar9);
      }
    }
    local_308._48_8_ = &local_340;
    in_stack_fffffffffffff87f = true;
    if ((char *)local_340.len != (char *)0x0) {
      in_stack_fffffffffffff87f = local_340.str == (char *)0x0;
    }
    if ((bool)in_stack_fffffffffffff87f != false) {
      memcpy(local_408,"check failed: (!trimmed.empty())",0x21);
      eVar6 = get_error_flags();
      if (((eVar6 & 1) != 0) && (bVar5 = is_debugger_attached(), bVar5)) {
        trap_instruction();
      }
      p_Var15 = (in_RDI->m_stack).m_callbacks.m_error;
      Location::Location((Location *)CONCAT17(in_stack_fffffffffffff767,in_stack_fffffffffffff760),
                         (char *)in_stack_fffffffffffff758,
                         CONCAT17(in_stack_fffffffffffff757,in_stack_fffffffffffff750),
                         (size_t)in_stack_fffffffffffff748,(size_t)in_stack_fffffffffffff740);
      in_stack_fffffffffffff750 = (undefined7)sStack_418;
      in_stack_fffffffffffff757 = (char)(sStack_418 >> 0x38);
      in_stack_fffffffffffff738 = (flag_t)local_430;
      in_stack_fffffffffffff73c = (flag_t)((ulong)local_430 >> 0x20);
      LVar2.super_LineCol.line = (size_t)pPStack_428;
      LVar2.super_LineCol.offset = (size_t)local_430;
      LVar2.super_LineCol.col = (size_t)local_420;
      LVar2.name.str._0_7_ = in_stack_fffffffffffff750;
      LVar2.name.str._7_1_ = in_stack_fffffffffffff757;
      LVar2.name.len = (size_t)local_410;
      (*p_Var15)(local_408,0x21,LVar2,(in_RDI->m_stack).m_callbacks.m_user_data);
      in_stack_fffffffffffff740 = pPStack_428;
      in_stack_fffffffffffff748 = local_420;
      in_stack_fffffffffffff758 = local_410;
    }
  }
  bVar5 = has_none(in_RDI,0x10c);
  if (!bVar5) {
    memcpy(local_468,"check failed: (has_none(RNXT|RSEQ|RMAP))",0x29);
    eVar6 = get_error_flags();
    if (((eVar6 & 1) != 0) && (bVar5 = is_debugger_attached(), bVar5)) {
      trap_instruction();
    }
    p_Var15 = (in_RDI->m_stack).m_callbacks.m_error;
    Location::Location((Location *)CONCAT17(in_stack_fffffffffffff767,in_stack_fffffffffffff760),
                       (char *)in_stack_fffffffffffff758,
                       CONCAT17(in_stack_fffffffffffff757,in_stack_fffffffffffff750),
                       (size_t)in_stack_fffffffffffff748,(size_t)in_stack_fffffffffffff740);
    in_stack_fffffffffffff750 = (undefined7)uStack_478;
    in_stack_fffffffffffff757 = SUB81(uStack_478,7);
    in_stack_fffffffffffff738 = (flag_t)local_490;
    in_stack_fffffffffffff73c = (flag_t)(local_490 >> 0x20);
    LVar3.super_LineCol.line = (size_t)pPStack_488;
    LVar3.super_LineCol.offset = local_490;
    LVar3.super_LineCol.col = (size_t)local_480;
    LVar3.name.str._0_7_ = in_stack_fffffffffffff750;
    LVar3.name.str._7_1_ = in_stack_fffffffffffff757;
    LVar3.name.len = (size_t)local_470;
    (*p_Var15)(local_468,0x29,LVar3,(in_RDI->m_stack).m_callbacks.m_user_data);
    in_stack_fffffffffffff740 = pPStack_488;
    in_stack_fffffffffffff748 = local_480;
    in_stack_fffffffffffff758 = local_470;
  }
  if (in_RDI->m_state->indref != 0) {
    pcVar10 = (char *)basic_substring<const_char>::first_not_of
                                ((basic_substring<const_char> *)
                                 CONCAT17(in_stack_fffffffffffff76f,
                                          CONCAT16(in_stack_fffffffffffff76e,
                                                   in_stack_fffffffffffff768)),
                                 in_stack_fffffffffffff767,(size_t)in_stack_fffffffffffff758);
    if ((ulong)local_308._8_8_ < pcVar10 && pcVar10 != (char *)0xffffffffffffffff) {
      eVar6 = get_error_flags();
      if (((eVar6 & 1) != 0) && (bVar5 = is_debugger_attached(), bVar5)) {
        trap_instruction();
      }
      handle_error(0x34dd90,(char *)0x1569,"check failed: %s","pos <= len || pos == npos");
    }
    if (pcVar10 == (char *)0xffffffffffffffff) {
      local_1a0 = (char *)local_308._0_8_;
      local_198 = (char *)local_308._8_8_;
    }
    else {
      basic_substring<const_char>::basic_substring
                ((basic_substring<const_char> *)
                 CONCAT17(in_stack_fffffffffffff767,in_stack_fffffffffffff760),
                 (char *)in_stack_fffffffffffff758,
                 CONCAT17(in_stack_fffffffffffff757,in_stack_fffffffffffff750));
    }
    local_4a0 = local_1a0;
    local_498 = local_198;
    if ((char *)in_RDI->m_state->indref <= local_198) {
      _line_progressed(in_stack_fffffffffffff820,
                       CONCAT17(in_stack_fffffffffffff81f,
                                CONCAT16(in_stack_fffffffffffff81e,in_stack_fffffffffffff818)));
      local_260 = (char *)in_RDI->m_state->indref;
      local_258 = local_308;
      if ((ulong)local_308._8_8_ < local_260) {
        eVar6 = get_error_flags();
        if (((eVar6 & 1) != 0) && (bVar5 = is_debugger_attached(), bVar5)) {
          trap_instruction();
        }
        local_270 = 
        "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
        ;
        local_268 = 0x1533;
        handle_error(0x34dd90,(char *)0x1533,"check failed: %s","first >= 0 && first <= len");
      }
      basic_substring<const_char>::basic_substring
                ((basic_substring<const_char> *)
                 CONCAT17(in_stack_fffffffffffff767,in_stack_fffffffffffff760),
                 (char *)in_stack_fffffffffffff758,
                 CONCAT17(in_stack_fffffffffffff757,in_stack_fffffffffffff750));
      local_4b0 = local_250;
      local_4a8 = local_248;
      local_308._0_8_ = local_250;
      local_308._8_8_ = local_248;
    }
  }
  basic_substring<char_const>::basic_substring<3ul>(local_4c0,(char (*) [3])0x361b80);
  pattern_02.str._7_1_ = in_stack_fffffffffffff767;
  pattern_02.str._0_7_ = in_stack_fffffffffffff760;
  pattern_02.len._0_6_ = in_stack_fffffffffffff768;
  pattern_02.len._6_1_ = in_stack_fffffffffffff76e;
  pattern_02.len._7_1_ = in_stack_fffffffffffff76f;
  bVar5 = basic_substring<const_char>::begins_with(in_stack_fffffffffffff758,pattern_02);
  if (bVar5) {
    _move_key_anchor_to_val_anchor(in_stack_fffffffffffff770);
    uVar13 = (undefined1)((ulong)stack0xfffffffffffffaf0 >> 0x38);
    _move_key_tag_to_val_tag(in_stack_fffffffffffff748);
    _push_level(in_stack_fffffffffffff7f0,(bool)in_stack_fffffffffffff7ef);
    _start_seq(in_stack_fffffffffffffaf8,(bool)uVar13);
    _save_indentation(in_stack_fffffffffffff880,
                      CONCAT17(in_stack_fffffffffffff87f,in_stack_fffffffffffff878));
    _line_progressed(in_stack_fffffffffffff820,
                     CONCAT17(in_stack_fffffffffffff81f,
                              CONCAT16(in_stack_fffffffffffff81e,in_stack_fffffffffffff818)));
    return true;
  }
  iVar7 = basic_substring<const_char>::compare(in_stack_fffffffffffff758,in_stack_fffffffffffff757);
  if (iVar7 == 0) {
    _move_key_anchor_to_val_anchor(in_stack_fffffffffffff770);
    uVar13 = (undefined1)((ulong)stack0xfffffffffffffaf0 >> 0x38);
    _move_key_tag_to_val_tag(in_stack_fffffffffffff748);
    _push_level(in_stack_fffffffffffff7f0,(bool)in_stack_fffffffffffff7ef);
    _start_seq(in_stack_fffffffffffffaf8,(bool)uVar13);
    _save_indentation(in_stack_fffffffffffff880,
                      CONCAT17(in_stack_fffffffffffff87f,in_stack_fffffffffffff878));
    _line_progressed(in_stack_fffffffffffff820,
                     CONCAT17(in_stack_fffffffffffff81f,
                              CONCAT16(in_stack_fffffffffffff81e,in_stack_fffffffffffff818)));
    return true;
  }
  bVar5 = basic_substring<const_char>::begins_with((basic_substring<const_char> *)local_308,'[');
  if (bVar5) {
    _move_key_anchor_to_val_anchor(in_stack_fffffffffffff770);
    uVar13 = (undefined1)((ulong)stack0xfffffffffffffaf0 >> 0x38);
    _move_key_tag_to_val_tag(in_stack_fffffffffffff748);
    _push_level(in_stack_fffffffffffff7f0,(bool)in_stack_fffffffffffff7ef);
    _start_seq(in_stack_fffffffffffffaf8,(bool)uVar13);
    add_flags(in_stack_fffffffffffff740,in_stack_fffffffffffff73c);
    _line_progressed(in_stack_fffffffffffff820,
                     CONCAT17(in_stack_fffffffffffff81f,
                              CONCAT16(in_stack_fffffffffffff81e,in_stack_fffffffffffff818)));
    return true;
  }
  bVar5 = basic_substring<const_char>::begins_with((basic_substring<const_char> *)local_308,'{');
  if (bVar5) {
    _move_key_anchor_to_val_anchor(in_stack_fffffffffffff770);
    _move_key_tag_to_val_tag(in_stack_fffffffffffff748);
    _push_level(in_stack_fffffffffffff7f0,(bool)in_stack_fffffffffffff7ef);
    _start_map(in_stack_fffffffffffffa98,(bool)in_stack_fffffffffffffa97);
    addrem_flags(in_stack_fffffffffffff740,in_stack_fffffffffffff73c,in_stack_fffffffffffff738);
    _line_progressed(in_stack_fffffffffffff820,
                     CONCAT17(in_stack_fffffffffffff81f,
                              CONCAT16(in_stack_fffffffffffff81e,in_stack_fffffffffffff818)));
    return true;
  }
  basic_substring<char_const>::basic_substring<3ul>(local_4d0,(char (*) [3])"? ");
  pattern_03.str._7_1_ = in_stack_fffffffffffff767;
  pattern_03.str._0_7_ = in_stack_fffffffffffff760;
  pattern_03.len._0_6_ = in_stack_fffffffffffff768;
  pattern_03.len._6_1_ = in_stack_fffffffffffff76e;
  pattern_03.len._7_1_ = in_stack_fffffffffffff76f;
  bVar5 = basic_substring<const_char>::begins_with(in_stack_fffffffffffff758,pattern_03);
  if (bVar5) {
    _move_key_anchor_to_val_anchor(in_stack_fffffffffffff770);
    _move_key_tag_to_val_tag(in_stack_fffffffffffff748);
    _push_level(in_stack_fffffffffffff7f0,(bool)in_stack_fffffffffffff7ef);
    _start_map(in_stack_fffffffffffffa98,(bool)in_stack_fffffffffffffa97);
    addrem_flags(in_stack_fffffffffffff740,in_stack_fffffffffffff73c,in_stack_fffffffffffff738);
    _save_indentation(in_stack_fffffffffffff880,
                      CONCAT17(in_stack_fffffffffffff87f,in_stack_fffffffffffff878));
    _line_progressed(in_stack_fffffffffffff820,
                     CONCAT17(in_stack_fffffffffffff81f,
                              CONCAT16(in_stack_fffffffffffff81e,in_stack_fffffffffffff818)));
    return true;
  }
  basic_substring<char_const>::basic_substring<3ul>(local_4e0,(char (*) [3])0x34edcd);
  pattern_04.str._7_1_ = in_stack_fffffffffffff767;
  pattern_04.str._0_7_ = in_stack_fffffffffffff760;
  pattern_04.len._0_6_ = in_stack_fffffffffffff768;
  pattern_04.len._6_1_ = in_stack_fffffffffffff76e;
  pattern_04.len._7_1_ = in_stack_fffffffffffff76f;
  bVar5 = basic_substring<const_char>::begins_with(in_stack_fffffffffffff758,pattern_04);
  if ((bVar5) && (bVar5 = has_all(in_RDI,0x200), !bVar5)) {
    _move_key_anchor_to_val_anchor(in_stack_fffffffffffff770);
    _move_key_tag_to_val_tag(in_stack_fffffffffffff748);
    _push_level(in_stack_fffffffffffff7f0,(bool)in_stack_fffffffffffff7ef);
    _start_map(in_stack_fffffffffffffa98,(bool)in_stack_fffffffffffffa97);
    _store_scalar_null(in_stack_fffffffffffff800,in_stack_fffffffffffff7f8);
    addrem_flags(in_stack_fffffffffffff740,in_stack_fffffffffffff73c,in_stack_fffffffffffff738);
    _save_indentation(in_stack_fffffffffffff880,
                      CONCAT17(in_stack_fffffffffffff87f,in_stack_fffffffffffff878));
    _line_progressed(in_stack_fffffffffffff820,
                     CONCAT17(in_stack_fffffffffffff81f,
                              CONCAT16(in_stack_fffffffffffff81e,in_stack_fffffffffffff818)));
    return true;
  }
  iVar7 = basic_substring<const_char>::compare(in_stack_fffffffffffff758,in_stack_fffffffffffff757);
  if ((iVar7 == 0) && (bVar5 = has_all(in_RDI,0x200), !bVar5)) {
    _move_key_anchor_to_val_anchor(in_stack_fffffffffffff770);
    _move_key_tag_to_val_tag(in_stack_fffffffffffff748);
    _push_level(in_stack_fffffffffffff7f0,(bool)in_stack_fffffffffffff7ef);
    _start_map(in_stack_fffffffffffffa98,(bool)in_stack_fffffffffffffa97);
    _store_scalar_null(in_stack_fffffffffffff800,in_stack_fffffffffffff7f8);
    addrem_flags(in_stack_fffffffffffff740,in_stack_fffffffffffff73c,in_stack_fffffffffffff738);
    _save_indentation(in_stack_fffffffffffff880,
                      CONCAT17(in_stack_fffffffffffff87f,in_stack_fffffffffffff878));
    _line_progressed(in_stack_fffffffffffff820,
                     CONCAT17(in_stack_fffffffffffff81f,
                              CONCAT16(in_stack_fffffffffffff81e,in_stack_fffffffffffff818)));
    return true;
  }
  bVar5 = _handle_types(in_stack_fffffffffffffdd8);
  if (bVar5) {
    return true;
  }
  bVar5 = basic_substring<const_char>::begins_with((basic_substring<const_char> *)local_308,'*');
  if ((!bVar5) && (bVar5 = _handle_key_anchors_and_refs(in_stack_fffffffffffff8a8), bVar5)) {
    return true;
  }
  bVar5 = has_all(in_RDI,0x200);
  if (!bVar5) {
    bVar5 = has_any(in_RDI,0x200);
    if (bVar5) {
      eVar6 = get_error_flags();
      if (((eVar6 & 1) != 0) && (bVar5 = is_debugger_attached(), bVar5)) {
        trap_instruction();
      }
      p_Var15 = (in_RDI->m_stack).m_callbacks.m_error;
      in_stack_fffffffffffff7f0 = (Parser *)&stack0xfffffffffffff988;
      Location::Location((Location *)CONCAT17(in_stack_fffffffffffff767,in_stack_fffffffffffff760),
                         (char *)in_stack_fffffffffffff758,
                         CONCAT17(in_stack_fffffffffffff757,in_stack_fffffffffffff750),
                         (size_t)in_stack_fffffffffffff748,(size_t)in_stack_fffffffffffff740);
      in_stack_fffffffffffff750 = (undefined7)uStack_688;
      in_stack_fffffffffffff757 = (char)((ulong)uStack_688 >> 0x38);
      LVar4.super_LineCol.line = uStack_698;
      LVar4.super_LineCol.offset = local_6a0;
      LVar4.super_LineCol.col = local_690;
      LVar4.name.str._0_7_ = in_stack_fffffffffffff750;
      LVar4.name.str._7_1_ = in_stack_fffffffffffff757;
      LVar4.name.len = (size_t)local_680;
      (*p_Var15)((char *)in_stack_fffffffffffff7f0,0x20,LVar4,
                 (in_RDI->m_stack).m_callbacks.m_user_data);
      in_stack_fffffffffffff758 = local_680;
    }
    basic_substring<const_char>::basic_substring(&local_6b0);
    sVar9 = (in_RDI->m_state->line_contents).indentation;
    bVar5 = _scan_scalar_unk(in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8,
                             in_stack_fffffffffffff9e0);
    if (!bVar5) {
      basic_substring<char_const>::basic_substring<3ul>
                ((basic_substring<char_const> *)&local_718,(char (*) [3])" \t");
      bVar5 = basic_substring<const_char>::begins_with_any
                        ((basic_substring<const_char> *)local_308,local_718);
      if (!bVar5) {
        return false;
      }
      basic_substring<char_const>::basic_substring<3ul>(local_738,(char (*) [3])" \t");
      chars_02.len._0_4_ = in_stack_fffffffffffff788;
      chars_02.str = (char *)in_stack_fffffffffffff780;
      chars_02.len._4_2_ = in_stack_fffffffffffff78c;
      chars_02.len._6_1_ = in_stack_fffffffffffff78e;
      chars_02.len._7_1_ = in_stack_fffffffffffff78f;
      pcVar10 = (char *)basic_substring<const_char>::first_not_of
                                  ((basic_substring<const_char> *)
                                   CONCAT17(in_stack_fffffffffffff77f,
                                            CONCAT16(in_stack_fffffffffffff77e,
                                                     CONCAT15(in_stack_fffffffffffff77d,
                                                              in_stack_fffffffffffff778))),chars_02,
                                   (size_t)in_stack_fffffffffffff770);
      puVar14 = (undefined8 *)local_308;
      if ((ulong)local_308._8_8_ < pcVar10 && pcVar10 != (char *)0xffffffffffffffff) {
        eVar6 = get_error_flags();
        if (((eVar6 & 1) != 0) && (bVar5 = is_debugger_attached(), bVar5)) {
          trap_instruction();
        }
        handle_error(0x34dd90,(char *)0x1569,"check failed: %s","pos <= len || pos == npos");
      }
      if (pcVar10 == (char *)0xffffffffffffffff) {
        local_1d0 = (char *)*puVar14;
        local_1c8 = (char *)puVar14[1];
      }
      else {
        basic_substring<const_char>::basic_substring
                  ((basic_substring<const_char> *)
                   CONCAT17(in_stack_fffffffffffff767,in_stack_fffffffffffff760),
                   (char *)in_stack_fffffffffffff758,
                   CONCAT17(in_stack_fffffffffffff757,in_stack_fffffffffffff750));
      }
      local_728 = local_1d0;
      local_720 = local_1c8;
      local_120 = local_1d0;
      local_118 = local_1c8;
      pcVar10 = local_308;
      local_f0 = local_1d0;
      local_e8 = local_1c8;
      if ((char *)local_308._8_8_ == (char *)0x0) {
        local_d9 = false;
        if ((local_1c8 == (char *)0x0) && (local_d9 = false, local_1d0 == (char *)local_308._0_8_))
        {
          local_d9 = (char *)local_308._0_8_ != (char *)0x0;
        }
      }
      else {
        local_d9 = (ulong)local_308._0_8_ <= local_1d0 &&
                   local_1d0 + (long)local_1c8 <= (char *)(local_308._0_8_ + local_308._8_8_);
      }
      if (local_d9 == false) {
        local_100 = &local_120;
      }
      local_f8 = pcVar10;
      if (local_d9 == false && (local_1c8 != (char *)0x0 && local_1d0 != (char *)0x0)) {
        eVar6 = get_error_flags();
        if (((eVar6 & 1) != 0) && (bVar5 = is_debugger_attached(), bVar5)) {
          trap_instruction();
        }
        handle_error(0x34dd90,(char *)0x159e,"check failed: %s","is_super(subs) || subs.empty()");
      }
      local_8 = &local_120;
      pcVar11 = local_120 + (long)local_118;
      local_18 = pcVar10;
      local_10 = pcVar10;
      if ((pcVar11 < (ulong)local_308._0_8_) ||
         ((char *)(local_308._0_8_ + local_308._8_8_) < pcVar11)) {
        local_38 = (char *)0x0;
        local_40 = (char *)0x0;
        local_68 = (char *)0x0;
        in_stack_fffffffffffff76f = 1;
        local_30 = pcVar10;
        basic_substring<const_char>::basic_substring
                  ((basic_substring<const_char> *)
                   CONCAT17(in_stack_fffffffffffff767,in_stack_fffffffffffff760),
                   (char *)in_stack_fffffffffffff758,
                   CONCAT17(in_stack_fffffffffffff757,in_stack_fffffffffffff750));
        local_110 = local_28;
        local_108 = local_20;
      }
      else {
        local_98 = pcVar11 + -local_308._0_8_;
        local_a0 = (char *)(local_308._0_8_ + local_308._8_8_) + -(long)pcVar11;
        local_90 = pcVar10;
        if ((ulong)local_308._8_8_ < local_98) {
          eVar6 = get_error_flags();
          if (((eVar6 & 1) != 0) && (bVar5 = is_debugger_attached(), bVar5)) {
            trap_instruction();
          }
          local_b0 = 
          "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
          ;
          local_a8 = 0x153a;
          handle_error(0x34dd90,(char *)0x153a,"check failed: %s","first >= 0 && first <= len");
        }
        if (*(char **)(pcVar10 + 8) < local_a0 && local_a0 != (char *)0xffffffffffffffff) {
          eVar6 = get_error_flags();
          if (((eVar6 & 1) != 0) && (bVar5 = is_debugger_attached(), bVar5)) {
            trap_instruction();
          }
          local_c0 = 
          "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
          ;
          local_b8 = 0x153b;
          handle_error(0x34dd90,(char *)0x153b,"check failed: %s",
                       "(num >= 0 && num <= len) || (num == npos)");
        }
        if (local_a0 == (char *)0xffffffffffffffff) {
          uVar12 = (undefined7)(*(long *)(pcVar10 + 8) - (long)local_98);
          uVar13 = (undefined1)((ulong)(*(long *)(pcVar10 + 8) - (long)local_98) >> 0x38);
        }
        else {
          uVar12 = SUB87(local_a0,0);
          uVar13 = (undefined1)((ulong)local_a0 >> 0x38);
        }
        local_c8 = (char *)CONCAT17(uVar13,uVar12);
        if (*(char **)(pcVar10 + 8) < local_98 + (long)local_c8 && local_a0 != (char *)0x0) {
          eVar6 = get_error_flags();
          if (((eVar6 & 1) != 0) && (bVar5 = is_debugger_attached(), bVar5)) {
            trap_instruction();
          }
          local_d8 = 
          "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
          ;
          local_d0 = 0x153d;
          handle_error(0x34dd90,(char *)0x153d,"check failed: %s",
                       "(first >= 0 && first + rnum <= len) || (num == 0)");
        }
        basic_substring<const_char>::basic_substring
                  ((basic_substring<const_char> *)
                   CONCAT17(in_stack_fffffffffffff767,in_stack_fffffffffffff760),
                   (char *)in_stack_fffffffffffff758,
                   CONCAT17(in_stack_fffffffffffff757,in_stack_fffffffffffff750));
        local_110 = local_88;
        local_108 = local_80;
      }
      local_308._0_8_ = local_110;
      local_308._8_8_ = local_108;
      bVar5 = has_all(in_RDI,1);
      if (bVar5) {
        basic_substring<char_const>::basic_substring<4ul>(local_768,(char (*) [4])"---");
        pattern_14.str._7_1_ = in_stack_fffffffffffff767;
        pattern_14.str._0_7_ = in_stack_fffffffffffff760;
        pattern_14.len._0_6_ = in_stack_fffffffffffff768;
        pattern_14.len._6_1_ = in_stack_fffffffffffff76e;
        pattern_14.len._7_1_ = in_stack_fffffffffffff76f;
        bVar5 = basic_substring<const_char>::begins_with(in_stack_fffffffffffff758,pattern_14);
        if (bVar5) {
          _set_indentation(in_RDI,(size_t)local_720);
        }
      }
      _line_progressed(in_stack_fffffffffffff820,
                       CONCAT17(in_stack_fffffffffffff81f,
                                CONCAT16(in_stack_fffffffffffff81e,in_stack_fffffffffffff818)));
      return true;
    }
    local_308._0_8_ = (in_RDI->m_state->line_contents).rem.str;
    local_308._8_8_ = (in_RDI->m_state->line_contents).rem.len;
    basic_substring<char_const>::basic_substring<3ul>
              ((basic_substring<char_const> *)&stack0xfffffffffffff928,(char (*) [3])" \t");
    chars_01.len._0_4_ = in_stack_fffffffffffff788;
    chars_01.str = (char *)in_stack_fffffffffffff780;
    chars_01.len._4_2_ = in_stack_fffffffffffff78c;
    chars_01.len._6_1_ = in_stack_fffffffffffff78e;
    chars_01.len._7_1_ = in_stack_fffffffffffff78f;
    pcVar10 = (char *)basic_substring<const_char>::first_not_of
                                ((basic_substring<const_char> *)
                                 CONCAT17(in_stack_fffffffffffff77f,
                                          CONCAT16(in_stack_fffffffffffff77e,
                                                   CONCAT15(in_stack_fffffffffffff77d,
                                                            in_stack_fffffffffffff778))),chars_01,
                                 (size_t)in_stack_fffffffffffff770);
    if ((pcVar10 != (char *)0x0) && (pcVar10 != (char *)0xffffffffffffffff)) {
      _line_progressed(in_stack_fffffffffffff820,
                       CONCAT17(in_stack_fffffffffffff81f,
                                CONCAT16(in_stack_fffffffffffff81e,in_stack_fffffffffffff818)));
      local_2b8 = local_308;
      in_stack_fffffffffffff7ef = (undefined1)((ulong)local_2b8 >> 0x38);
      local_2c0 = pcVar10;
      if ((ulong)local_308._8_8_ < pcVar10) {
        eVar6 = get_error_flags();
        if (((eVar6 & 1) != 0) && (bVar5 = is_debugger_attached(), bVar5)) {
          trap_instruction();
        }
        local_308._56_8_ =
             "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
        ;
        local_2c8 = 0x1533;
        handle_error(0x34dd90,(char *)0x1533,"check failed: %s","first >= 0 && first <= len");
      }
      basic_substring<const_char>::basic_substring
                ((basic_substring<const_char> *)
                 CONCAT17(in_stack_fffffffffffff767,in_stack_fffffffffffff760),
                 (char *)in_stack_fffffffffffff758,
                 CONCAT17(in_stack_fffffffffffff757,in_stack_fffffffffffff750));
      local_308._0_8_ = local_2b0;
      local_308._8_8_ = local_2a8;
    }
    local_6f8 = local_6b0.str;
    local_6f0 = local_6b0.len;
    s_00.str._5_1_ = in_stack_fffffffffffff79d;
    s_00.str._0_5_ = in_stack_fffffffffffff798;
    s_00.str._6_1_ = in_stack_fffffffffffff79e;
    s_00.str._7_1_ = in_stack_fffffffffffff79f;
    s_00.len = in_stack_fffffffffffff7a0;
    _store_scalar((Parser *)CONCAT17(in_stack_fffffffffffff797,in_stack_fffffffffffff790),s_00,
                  CONCAT13(in_stack_fffffffffffff78f,
                           CONCAT12(in_stack_fffffffffffff78e,in_stack_fffffffffffff78c)));
    basic_substring<char_const>::basic_substring<3ul>(local_708,(char (*) [3])0x34edcd);
    pattern_13.str._7_1_ = in_stack_fffffffffffff767;
    pattern_13.str._0_7_ = in_stack_fffffffffffff760;
    pattern_13.len._0_6_ = in_stack_fffffffffffff768;
    pattern_13.len._6_1_ = in_stack_fffffffffffff76e;
    pattern_13.len._7_1_ = in_stack_fffffffffffff76f;
    bVar5 = basic_substring<const_char>::begins_with(in_stack_fffffffffffff758,pattern_13);
    if (bVar5) {
      _push_level(in_stack_fffffffffffff7f0,(bool)in_stack_fffffffffffff7ef);
      _start_map(in_stack_fffffffffffffa98,(bool)in_stack_fffffffffffffa97);
      _set_indentation(in_RDI,sVar9);
      _line_progressed(in_stack_fffffffffffff820,
                       CONCAT17(in_stack_fffffffffffff81f,
                                CONCAT16(in_stack_fffffffffffff81e,in_stack_fffffffffffff818)));
    }
    else {
      iVar7 = basic_substring<const_char>::compare
                        ((basic_substring<const_char> *)
                         CONCAT17(in_stack_fffffffffffff7bf,
                                  CONCAT16(in_stack_fffffffffffff7be,
                                           CONCAT15(in_stack_fffffffffffff7bd,
                                                    CONCAT14(in_stack_fffffffffffff7bc,
                                                             in_stack_fffffffffffff7b8)))),
                         in_stack_fffffffffffff7b0,
                         CONCAT17(in_stack_fffffffffffff7af,in_stack_fffffffffffff7a8));
      if (iVar7 == 0) {
        _push_level(in_stack_fffffffffffff7f0,(bool)in_stack_fffffffffffff7ef);
        _start_map(in_stack_fffffffffffffa98,(bool)in_stack_fffffffffffffa97);
        _set_indentation(in_RDI,sVar9);
        _line_progressed(in_stack_fffffffffffff820,
                         CONCAT17(in_stack_fffffffffffff81f,
                                  CONCAT16(in_stack_fffffffffffff81e,in_stack_fffffffffffff818)));
      }
    }
    return true;
  }
  basic_substring<const_char>::basic_substring(&local_4f0);
  bVar5 = _scan_scalar_unk(in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8,
                           in_stack_fffffffffffff9e0);
  if (bVar5) {
    local_308._0_8_ = (in_RDI->m_state->line_contents).rem.str;
    local_308._8_8_ = (in_RDI->m_state->line_contents).rem.len;
    basic_substring<char_const>::basic_substring<3ul>
              ((basic_substring<char_const> *)&stack0xfffffffffffffaf8,(char (*) [3])" \t");
    chars_04.len = local_500;
    chars_04.str = (char *)in_stack_fffffffffffffaf8;
    bVar5 = basic_substring<const_char>::begins_with_any
                      ((basic_substring<const_char> *)local_308,chars_04);
    if (bVar5) {
      basic_substring<char_const>::basic_substring<3ul>(local_520,(char (*) [3])" \t");
      chars.len._0_4_ = in_stack_fffffffffffff788;
      chars.str = (char *)in_stack_fffffffffffff780;
      chars.len._4_2_ = in_stack_fffffffffffff78c;
      chars.len._6_1_ = in_stack_fffffffffffff78e;
      chars.len._7_1_ = in_stack_fffffffffffff78f;
      register0x00000000 =
           (char *)basic_substring<const_char>::first_not_of
                             ((basic_substring<const_char> *)
                              CONCAT17(in_stack_fffffffffffff77f,
                                       CONCAT16(in_stack_fffffffffffff77e,
                                                CONCAT15(in_stack_fffffffffffff77d,
                                                         in_stack_fffffffffffff778))),chars,
                              (size_t)in_stack_fffffffffffff770);
      in_stack_fffffffffffff820 = (Parser *)local_308;
      local_290 = register0x00000000;
      local_288 = in_stack_fffffffffffff820;
      if ((ulong)local_308._8_8_ < register0x00000000) {
        eVar6 = get_error_flags();
        if (((eVar6 & 1) != 0) &&
           (in_stack_fffffffffffff81f = is_debugger_attached(), (bool)in_stack_fffffffffffff81f)) {
          trap_instruction();
        }
        local_2a0 = 
        "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
        ;
        local_298 = 0x1533;
        handle_error(0x34dd90,(char *)0x1533,"check failed: %s","first >= 0 && first <= len");
      }
      basic_substring<const_char>::basic_substring
                ((basic_substring<const_char> *)
                 CONCAT17(in_stack_fffffffffffff767,in_stack_fffffffffffff760),
                 (char *)in_stack_fffffffffffff758,
                 CONCAT17(in_stack_fffffffffffff757,in_stack_fffffffffffff750));
      local_530 = local_280;
      local_528 = local_278;
      local_308._0_8_ = local_280;
      local_308._8_8_ = local_278;
      _line_progressed(in_stack_fffffffffffff820,
                       CONCAT17(in_stack_fffffffffffff81f,
                                CONCAT16(in_stack_fffffffffffff81e,in_stack_fffffffffffff818)));
    }
  }
  basic_substring<char_const>::basic_substring<3ul>(local_540,(char (*) [3])0x34eb92);
  pattern_05.str._7_1_ = in_stack_fffffffffffff767;
  pattern_05.str._0_7_ = in_stack_fffffffffffff760;
  pattern_05.len._0_6_ = in_stack_fffffffffffff768;
  pattern_05.len._6_1_ = in_stack_fffffffffffff76e;
  pattern_05.len._7_1_ = in_stack_fffffffffffff76f;
  bVar5 = basic_substring<const_char>::begins_with(in_stack_fffffffffffff758,pattern_05);
  pcVar10 = stack0xfffffffffffffaf0;
  if (bVar5) {
    uVar13 = (undefined1)((ulong)stack0xfffffffffffffaf0 >> 0x38);
    bVar5 = (bool)uVar13;
    unique0x10003a34 = pcVar10;
    _start_seq(in_stack_fffffffffffffaf8,bVar5);
    add_flags(in_stack_fffffffffffff740,in_stack_fffffffffffff73c);
    _consume_scalar((Parser *)
                    CONCAT17(in_stack_fffffffffffff78f,
                             CONCAT16(in_stack_fffffffffffff78e,
                                      CONCAT24(in_stack_fffffffffffff78c,in_stack_fffffffffffff788))
                            ));
    _append_val(in_stack_fffffffffffff920,in_stack_fffffffffffff928,quoted);
    _line_progressed(in_stack_fffffffffffff820,
                     CONCAT17(in_stack_fffffffffffff81f,
                              CONCAT16(in_stack_fffffffffffff81e,in_stack_fffffffffffff818)));
  }
  else {
    bVar5 = basic_substring<const_char>::begins_with((basic_substring<const_char> *)local_308,',');
    pcVar10 = stack0xfffffffffffffaf0;
    if (bVar5) {
      uVar13 = (undefined1)((ulong)stack0xfffffffffffffaf0 >> 0x38);
      bVar5 = (bool)uVar13;
      unique0x10003a3c = pcVar10;
      _start_seq(in_stack_fffffffffffffaf8,bVar5);
      add_flags(in_stack_fffffffffffff740,in_stack_fffffffffffff73c);
      _consume_scalar((Parser *)
                      CONCAT17(in_stack_fffffffffffff78f,
                               CONCAT16(in_stack_fffffffffffff78e,
                                        CONCAT24(in_stack_fffffffffffff78c,in_stack_fffffffffffff788
                                                ))));
      _append_val(in_stack_fffffffffffff920,in_stack_fffffffffffff928,quoted);
      _line_progressed(in_stack_fffffffffffff820,
                       CONCAT17(in_stack_fffffffffffff81f,
                                CONCAT16(in_stack_fffffffffffff81e,in_stack_fffffffffffff818)));
    }
    else {
      basic_substring<char_const>::basic_substring<3ul>(local_570,(char (*) [3])0x34edcd);
      pattern_06.str._7_1_ = in_stack_fffffffffffff767;
      pattern_06.str._0_7_ = in_stack_fffffffffffff760;
      pattern_06.len._0_6_ = in_stack_fffffffffffff768;
      pattern_06.len._6_1_ = in_stack_fffffffffffff76e;
      pattern_06.len._7_1_ = in_stack_fffffffffffff76f;
      bVar5 = basic_substring<const_char>::begins_with(in_stack_fffffffffffff758,pattern_06);
      if (bVar5) {
        _start_map_unk((Parser *)
                       CONCAT17(in_stack_fffffffffffff76f,
                                CONCAT16(in_stack_fffffffffffff76e,in_stack_fffffffffffff768)),
                       (bool)in_stack_fffffffffffff767);
        _line_progressed(in_stack_fffffffffffff820,
                         CONCAT17(in_stack_fffffffffffff81f,
                                  CONCAT16(in_stack_fffffffffffff81e,in_stack_fffffffffffff818)));
      }
      else {
        iVar7 = basic_substring<const_char>::compare
                          ((basic_substring<const_char> *)
                           CONCAT17(in_stack_fffffffffffff7bf,
                                    CONCAT16(in_stack_fffffffffffff7be,
                                             CONCAT15(in_stack_fffffffffffff7bd,
                                                      CONCAT14(in_stack_fffffffffffff7bc,
                                                               in_stack_fffffffffffff7b8)))),
                           in_stack_fffffffffffff7b0,
                           CONCAT17(in_stack_fffffffffffff7af,in_stack_fffffffffffff7a8));
        if (iVar7 != 0) {
          basic_substring<char_const>::basic_substring<3ul>(local_580,(char (*) [3])":\"");
          pattern_07.str._7_1_ = in_stack_fffffffffffff767;
          pattern_07.str._0_7_ = in_stack_fffffffffffff760;
          pattern_07.len._0_6_ = in_stack_fffffffffffff768;
          pattern_07.len._6_1_ = in_stack_fffffffffffff76e;
          pattern_07.len._7_1_ = in_stack_fffffffffffff76f;
          bVar5 = basic_substring<const_char>::begins_with(in_stack_fffffffffffff758,pattern_07);
          if (!bVar5) {
            basic_substring<char_const>::basic_substring<3ul>(local_590,(char (*) [3])0x34d204);
            pattern_08.str._7_1_ = in_stack_fffffffffffff767;
            pattern_08.str._0_7_ = in_stack_fffffffffffff760;
            pattern_08.len._0_6_ = in_stack_fffffffffffff768;
            pattern_08.len._6_1_ = in_stack_fffffffffffff76e;
            pattern_08.len._7_1_ = in_stack_fffffffffffff76f;
            bVar5 = basic_substring<const_char>::begins_with(in_stack_fffffffffffff758,pattern_08);
            if (!bVar5) {
              bVar5 = basic_substring<const_char>::begins_with
                                ((basic_substring<const_char> *)local_308,'}');
              if (bVar5) {
                bVar5 = has_all(in_RDI,0x14);
                if (!bVar5) {
                  bVar5 = is_debugger_attached();
                  if ((bVar5) && (bVar5 = is_debugger_attached(), bVar5)) {
                    trap_instruction();
                  }
                  basic_substring<char_const>::basic_substring<40ul>
                            (local_5a0,(char (*) [40])"ERROR: invalid token: not reading a map");
                  _err<>(in_stack_fffffffffffffc00,in_stack_fffffffffffffc08);
                }
                bVar5 = has_all(in_RDI,0x200);
                if (!bVar5) {
                  bVar5 = is_debugger_attached();
                  if ((bVar5) && (bVar5 = is_debugger_attached(), bVar5)) {
                    trap_instruction();
                  }
                  basic_substring<char_const>::basic_substring<24ul>
                            (local_5b0,(char (*) [24])"ERROR: no scalar stored");
                  _err<>(in_stack_fffffffffffffc00,in_stack_fffffffffffffc08);
                }
                local_5c0 = local_4f0.str;
                local_5b8 = local_4f0.len;
                val.len = in_stack_fffffffffffff8b8;
                val.str = in_stack_fffffffffffff8b0;
                _append_key_val(in_stack_fffffffffffff8a8,val,in_stack_fffffffffffff8a4);
                _stop_map(in_stack_fffffffffffff7d8);
                _line_progressed(in_stack_fffffffffffff820,
                                 CONCAT17(in_stack_fffffffffffff81f,
                                          CONCAT16(in_stack_fffffffffffff81e,
                                                   in_stack_fffffffffffff818)));
              }
              else {
                basic_substring<char_const>::basic_substring<4ul>(local_5d0,(char (*) [4])0x347579);
                pattern_09.str._7_1_ = in_stack_fffffffffffff767;
                pattern_09.str._0_7_ = in_stack_fffffffffffff760;
                pattern_09.len._0_6_ = in_stack_fffffffffffff768;
                pattern_09.len._6_1_ = in_stack_fffffffffffff76e;
                pattern_09.len._7_1_ = in_stack_fffffffffffff76f;
                bVar5 = basic_substring<const_char>::begins_with
                                  (in_stack_fffffffffffff758,pattern_09);
                if (!bVar5) {
                  bVar5 = basic_substring<const_char>::begins_with
                                    ((basic_substring<const_char> *)local_308,'#');
                  if (bVar5) {
                    _scan_comment((Parser *)
                                  CONCAT17(in_stack_fffffffffffff80f,in_stack_fffffffffffff808));
                    return true;
                  }
                  bVar5 = _handle_key_anchors_and_refs(in_stack_fffffffffffff8a8);
                  if (bVar5) {
                    return true;
                  }
                  basic_substring<char_const>::basic_substring<2ul>
                            (local_5f0,(char (*) [2])0x361da5);
                  pattern_10.str._7_1_ = in_stack_fffffffffffff767;
                  pattern_10.str._0_7_ = in_stack_fffffffffffff760;
                  pattern_10.len._0_6_ = in_stack_fffffffffffff768;
                  pattern_10.len._6_1_ = in_stack_fffffffffffff76e;
                  pattern_10.len._7_1_ = in_stack_fffffffffffff76f;
                  bVar5 = basic_substring<const_char>::begins_with
                                    (in_stack_fffffffffffff758,pattern_10);
                  if (!bVar5) {
                    basic_substring<char_const>::basic_substring<2ul>
                              (local_600,(char (*) [2])0x361d1d);
                    pattern_11.str._7_1_ = in_stack_fffffffffffff767;
                    pattern_11.str._0_7_ = in_stack_fffffffffffff760;
                    pattern_11.len._0_6_ = in_stack_fffffffffffff768;
                    pattern_11.len._6_1_ = in_stack_fffffffffffff76e;
                    pattern_11.len._7_1_ = in_stack_fffffffffffff76f;
                    bVar5 = basic_substring<const_char>::begins_with
                                      (in_stack_fffffffffffff758,pattern_11);
                    if (!bVar5) {
                      local_308._40_8_ = local_308;
                      uVar16 = (char *)local_308._8_8_ == (char *)0x0 ||
                               (char *)local_308._0_8_ == (char *)0x0;
                      if ((char *)local_308._8_8_ != (char *)0x0 &&
                          (char *)local_308._0_8_ != (char *)0x0) {
                        local_238 = local_308;
                        local_240 = "---";
                        iVar7 = basic_substring<const_char>::compare
                                          ((basic_substring<const_char> *)
                                           CONCAT17(in_stack_fffffffffffff7bf,
                                                    CONCAT16(in_stack_fffffffffffff7be,
                                                             CONCAT15(in_stack_fffffffffffff7bd,
                                                                      CONCAT14(
                                                  in_stack_fffffffffffff7bc,
                                                  in_stack_fffffffffffff7b8)))),
                                           in_stack_fffffffffffff7b0,
                                           CONCAT17(in_stack_fffffffffffff7af,
                                                    in_stack_fffffffffffff7a8));
                        if (iVar7 != 0) {
                          basic_substring<char_const>::basic_substring<5ul>
                                    (local_628,(char (*) [5])"--- ");
                          pattern_12.str._7_1_ = in_stack_fffffffffffff767;
                          pattern_12.str._0_7_ = in_stack_fffffffffffff760;
                          pattern_12.len._0_6_ = in_stack_fffffffffffff768;
                          pattern_12.len._6_1_ = in_stack_fffffffffffff76e;
                          pattern_12.len._7_1_ = in_stack_fffffffffffff76f;
                          bVar5 = basic_substring<const_char>::begins_with
                                            (in_stack_fffffffffffff758,pattern_12);
                          if (!bVar5) {
                            bVar5 = basic_substring<const_char>::begins_with
                                              ((basic_substring<const_char> *)local_308,'%');
                            if (bVar5) {
                              _line_progressed(in_stack_fffffffffffff820,
                                               CONCAT17(in_stack_fffffffffffff81f,
                                                        CONCAT16(uVar16,in_stack_fffffffffffff818)))
                              ;
                              return true;
                            }
                            bVar5 = is_debugger_attached();
                            if ((bVar5) && (bVar5 = is_debugger_attached(), bVar5)) {
                              trap_instruction();
                            }
                            basic_substring<char_const>::basic_substring<19ul>
                                      ((basic_substring<char_const> *)&stack0xfffffffffffff9b8,
                                       (char (*) [19])"ERROR: parse error");
                            _err<>(in_stack_fffffffffffffc00,in_stack_fffffffffffffc08);
                            goto LAB_003031ee;
                          }
                        }
                        local_638 = (char *)local_308._0_8_;
                        local_630 = (char *)local_308._8_8_;
                        rem_02.str._7_1_ = in_stack_fffffffffffff7ef;
                        rem_02.str._0_7_ = in_stack_fffffffffffff7e8;
                        rem_02.len = (size_t)in_stack_fffffffffffff7f0;
                        _start_new_doc((Parser *)
                                       CONCAT17(in_stack_fffffffffffff7e7,
                                                CONCAT16(in_stack_fffffffffffff7e6,
                                                         in_stack_fffffffffffff7e0)),rem_02);
                        return true;
                      }
                      goto LAB_003031ee;
                    }
                  }
                  basic_substring<char_const>::basic_substring<3ul>
                            ((basic_substring<char_const> *)&stack0xfffffffffffff9e8,
                             (char (*) [3])" \t");
                  chars_00.len._0_4_ = in_stack_fffffffffffff788;
                  chars_00.str = (char *)in_stack_fffffffffffff780;
                  chars_00.len._4_2_ = in_stack_fffffffffffff78c;
                  chars_00.len._6_1_ = in_stack_fffffffffffff78e;
                  chars_00.len._7_1_ = in_stack_fffffffffffff78f;
                  basic_substring<const_char>::first_not_of
                            ((basic_substring<const_char> *)
                             CONCAT17(in_stack_fffffffffffff77f,
                                      CONCAT16(in_stack_fffffffffffff77e,
                                               CONCAT15(in_stack_fffffffffffff77d,
                                                        in_stack_fffffffffffff778))),chars_00,
                             (size_t)in_stack_fffffffffffff770);
                  _line_progressed(in_stack_fffffffffffff820,
                                   CONCAT17(in_stack_fffffffffffff81f,
                                            CONCAT16(in_stack_fffffffffffff81e,
                                                     in_stack_fffffffffffff818)));
                  return true;
                }
                _end_stream(in_stack_fffffffffffff988);
                _line_progressed(in_stack_fffffffffffff820,
                                 CONCAT17(in_stack_fffffffffffff81f,
                                          CONCAT16(in_stack_fffffffffffff81e,
                                                   in_stack_fffffffffffff818)));
              }
              goto LAB_003031ee;
            }
          }
        }
        basic_substring<const_char>::compare
                  ((basic_substring<const_char> *)
                   CONCAT17(in_stack_fffffffffffff7bf,
                            CONCAT16(in_stack_fffffffffffff7be,
                                     CONCAT15(in_stack_fffffffffffff7bd,
                                              CONCAT14(in_stack_fffffffffffff7bc,
                                                       in_stack_fffffffffffff7b8)))),
                   in_stack_fffffffffffff7b0,
                   CONCAT17(in_stack_fffffffffffff7af,in_stack_fffffffffffff7a8));
        _start_map_unk((Parser *)
                       CONCAT17(in_stack_fffffffffffff76f,
                                CONCAT16(in_stack_fffffffffffff76e,in_stack_fffffffffffff768)),
                       (bool)in_stack_fffffffffffff767);
        _line_progressed(in_stack_fffffffffffff820,
                         CONCAT17(in_stack_fffffffffffff81f,
                                  CONCAT16(in_stack_fffffffffffff81e,in_stack_fffffffffffff818)));
      }
    }
  }
LAB_003031ee:
  local_308._32_8_ = &local_4f0;
  if (local_4f0.len != 0 && local_4f0.str != (char *)0x0) {
    s.str._5_1_ = in_stack_fffffffffffff79d;
    s.str._0_5_ = in_stack_fffffffffffff798;
    s.str._6_1_ = in_stack_fffffffffffff79e;
    s.str._7_1_ = in_stack_fffffffffffff79f;
    s.len = in_stack_fffffffffffff7a0;
    _store_scalar((Parser *)CONCAT17(in_stack_fffffffffffff797,in_stack_fffffffffffff790),s,
                  CONCAT13(in_stack_fffffffffffff78f,
                           CONCAT12(in_stack_fffffffffffff78e,in_stack_fffffffffffff78c)));
  }
  return true;
}

Assistant:

bool Parser::_handle_unk()
{
    _c4dbgp("handle_unk");

    csubstr rem = m_state->line_contents.rem;
    const bool start_as_child = (node(m_state) == nullptr);

    if(C4_UNLIKELY(has_any(NDOC)))
    {
        if(rem == "---" || rem.begins_with("--- "))
        {
            _start_new_doc(rem);
            return true;
        }
        auto trimmed = rem.triml(' ');
        if(trimmed == "---" || trimmed.begins_with("--- "))
        {
            _RYML_CB_ASSERT(m_stack.m_callbacks, rem.len >= trimmed.len);
            _line_progressed(rem.len - trimmed.len);
            _start_new_doc(trimmed);
            _save_indentation();
            return true;
        }
        else if(trimmed.begins_with("..."))
        {
            _end_stream();
        }
        else if(trimmed.first_of("#%") == csubstr::npos) // neither a doc nor a tag
        {
            _c4dbgpf("starting implicit doc to accomodate unexpected tokens: '{}'", rem);
            size_t indref = m_state->indref;
            _push_level();
            _start_doc();
            _set_indentation(indref);
        }
        _RYML_CB_ASSERT(m_stack.m_callbacks, !trimmed.empty());
    }

    _RYML_CB_ASSERT(m_stack.m_callbacks, has_none(RNXT|RSEQ|RMAP));
    if(m_state->indref > 0)
    {
        csubstr ws = rem.left_of(rem.first_not_of(' '));
        if(m_state->indref <= ws.len)
        {
            _c4dbgpf("skipping base indentation of {}", m_state->indref);
            _line_progressed(m_state->indref);
            rem = rem.sub(m_state->indref);
        }
    }

    if(rem.begins_with("- ") _RYML_WITH_TAB_TOKENS( || rem.begins_with("-\t")))
    {
        _c4dbgpf("it's a seq (as_child={})", start_as_child);
        _move_key_anchor_to_val_anchor();
        _move_key_tag_to_val_tag();
        _push_level();
        _start_seq(start_as_child);
        _save_indentation();
        _line_progressed(2);
        return true;
    }
    else if(rem == '-')
    {
        _c4dbgpf("it's a seq (as_child={})", start_as_child);
        _move_key_anchor_to_val_anchor();
        _move_key_tag_to_val_tag();
        _push_level();
        _start_seq(start_as_child);
        _save_indentation();
        _line_progressed(1);
        return true;
    }
    else if(rem.begins_with('['))
    {
        _c4dbgpf("it's a seq, flow (as_child={})", start_as_child);
        _move_key_anchor_to_val_anchor();
        _move_key_tag_to_val_tag();
        _push_level(/*explicit flow*/true);
        _start_seq(start_as_child);
        add_flags(FLOW);
        _line_progressed(1);
        return true;
    }
    else if(rem.begins_with('{'))
    {
        _c4dbgpf("it's a map, flow (as_child={})", start_as_child);
        _move_key_anchor_to_val_anchor();
        _move_key_tag_to_val_tag();
        _push_level(/*explicit flow*/true);
        _start_map(start_as_child);
        addrem_flags(FLOW|RKEY, RVAL);
        _line_progressed(1);
        return true;
    }
    else if(rem.begins_with("? "))
    {
        _c4dbgpf("it's a map (as_child={}) + this key is complex", start_as_child);
        _move_key_anchor_to_val_anchor();
        _move_key_tag_to_val_tag();
        _push_level();
        _start_map(start_as_child);
        addrem_flags(RKEY|QMRK, RVAL);
        _save_indentation();
        _line_progressed(2);
        return true;
    }
    else if(rem.begins_with(": ") && !has_all(SSCL))
    {
        _c4dbgp("it's a map with an empty key");
        _move_key_anchor_to_val_anchor();
        _move_key_tag_to_val_tag();
        _push_level();
        _start_map(start_as_child);
        _store_scalar_null(rem.str);
        addrem_flags(RVAL, RKEY);
        _save_indentation();
        _line_progressed(2);
        return true;
    }
    else if(rem == ':' && !has_all(SSCL))
    {
        _c4dbgp("it's a map with an empty key");
        _move_key_anchor_to_val_anchor();
        _move_key_tag_to_val_tag();
        _push_level();
        _start_map(start_as_child);
        _store_scalar_null(rem.str);
        addrem_flags(RVAL, RKEY);
        _save_indentation();
        _line_progressed(1);
        return true;
    }
    else if(_handle_types())
    {
        return true;
    }
    else if(!rem.begins_with('*') && _handle_key_anchors_and_refs())
    {
        return true;
    }
    else if(has_all(SSCL))
    {
        _c4dbgpf("there's a stored scalar: '{}'", m_state->scalar);

        csubstr saved_scalar;
        bool is_quoted;
        if(_scan_scalar_unk(&saved_scalar, &is_quoted))
        {
            rem = m_state->line_contents.rem;
            _c4dbgpf("... and there's also a scalar next! '{}'", saved_scalar);
            if(rem.begins_with_any(" \t"))
            {
                size_t n = rem.first_not_of(" \t");
                _c4dbgpf("skipping {} spaces/tabs", n);
                rem = rem.sub(n);
                _line_progressed(n);
            }
        }

        _c4dbgpf("rem='{}'", rem);

        if(rem.begins_with(", "))
        {
            _c4dbgpf("got a ',' -- it's a seq (as_child={})", start_as_child);
            _start_seq(start_as_child);
            add_flags(FLOW);
            _append_val(_consume_scalar());
            _line_progressed(2);
        }
        else if(rem.begins_with(','))
        {
            _c4dbgpf("got a ',' -- it's a seq (as_child={})", start_as_child);
            _start_seq(start_as_child);
            add_flags(FLOW);
            _append_val(_consume_scalar());
            _line_progressed(1);
        }
        else if(rem.begins_with(": ") _RYML_WITH_TAB_TOKENS( || rem.begins_with(":\t")))
        {
            _c4dbgpf("got a ': ' -- it's a map (as_child={})", start_as_child);
            _start_map_unk(start_as_child); // wait for the val scalar to append the key-val pair
            _line_progressed(2);
        }
        else if(rem == ":" || rem.begins_with(":\"") || rem.begins_with(":'"))
        {
            if(rem == ":") { _c4dbgpf("got a ':' -- it's a map (as_child={})", start_as_child); }
            else { _c4dbgpf("got a '{}' -- it's a map (as_child={})", rem.first(2), start_as_child); }
            _start_map_unk(start_as_child); // wait for the val scalar to append the key-val pair
            _line_progressed(1); // advance only 1
        }
        else if(rem.begins_with('}'))
        {
            if(!has_all(RMAP|FLOW))
            {
                _c4err("invalid token: not reading a map");
            }
            if(!has_all(SSCL))
            {
                _c4err("no scalar stored");
            }
            _append_key_val(saved_scalar);
            _stop_map();
            _line_progressed(1);
        }
        else if(rem.begins_with("..."))
        {
            _c4dbgp("got stream end '...'");
            _end_stream();
            _line_progressed(3);
        }
        else if(rem.begins_with('#'))
        {
            _c4dbgpf("it's a comment: '{}'", rem);
            _scan_comment();
            return true;
        }
        else if(_handle_key_anchors_and_refs())
        {
            return true;
        }
        else if(rem.begins_with(" ") || rem.begins_with("\t"))
        {
            size_t n = rem.first_not_of(" \t");
            if(n == npos)
                n = rem.len;
            _c4dbgpf("has {} spaces/tabs, skip...", n);
            _line_progressed(n);
            return true;
        }
        else if(rem.empty())
        {
            // nothing to do
        }
        else if(rem == "---" || rem.begins_with("--- "))
        {
            _c4dbgp("caught ---: starting doc");
            _start_new_doc(rem);
            return true;
        }
        else if(rem.begins_with('%'))
        {
            _c4dbgp("caught a directive: ignoring...");
            _line_progressed(rem.len);
            return true;
        }
        else
        {
            _c4err("parse error");
        }

        if( ! saved_scalar.empty())
        {
            _store_scalar(saved_scalar, is_quoted);
        }

        return true;
    }
    else
    {
        _RYML_CB_ASSERT(m_stack.m_callbacks,  ! has_any(SSCL));
        csubstr scalar;
        size_t indentation = m_state->line_contents.indentation; // save
        bool is_quoted;
        if(_scan_scalar_unk(&scalar, &is_quoted))
        {
            _c4dbgpf("got a {} scalar", is_quoted ? "quoted" : "");
            rem = m_state->line_contents.rem;
            {
                size_t first = rem.first_not_of(" \t");
                if(first && first != npos)
                {
                    _c4dbgpf("skip {} whitespace characters", first);
                   _line_progressed(first);
                   rem = rem.sub(first);
                }
            }
            _store_scalar(scalar, is_quoted);
            if(rem.begins_with(": ") _RYML_WITH_TAB_TOKENS( || rem.begins_with(":\t")))
            {
                _c4dbgpf("got a ': ' next -- it's a map (as_child={})", start_as_child);
                _push_level();
                _start_map(start_as_child); // wait for the val scalar to append the key-val pair
                _set_indentation(indentation);
                _line_progressed(2); // call this AFTER saving the indentation
            }
            else if(rem == ":")
            {
                _c4dbgpf("got a ':' next -- it's a map (as_child={})", start_as_child);
                _push_level();
                _start_map(start_as_child); // wait for the val scalar to append the key-val pair
                _set_indentation(indentation);
                _line_progressed(1); // call this AFTER saving the indentation
            }
            else
            {
                // we still don't know whether it's a seq or a map
                // so just store the scalar
            }
            return true;
        }
        else if(rem.begins_with_any(" \t"))
        {
            csubstr ws = rem.left_of(rem.first_not_of(" \t"));
            rem = rem.right_of(ws);
            if(has_all(RTOP) && rem.begins_with("---"))
            {
                _c4dbgp("there's a doc starting, and it's indented");
                _set_indentation(ws.len);
            }
            _c4dbgpf("skipping {} spaces/tabs", ws.len);
            _line_progressed(ws.len);
            return true;
        }
    }

    return false;
}